

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,XrWorldMeshBlockML *value
                         )

{
  bool bVar1;
  char cVar2;
  NextChainResult NVar3;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *p_Var4;
  XrResult XVar5;
  string asStack_398 [4];
  uint32_t in_stack_fffffffffffffc6c;
  allocator local_36a;
  allocator local_369;
  string local_368;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  string error_message;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_198;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_180;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_168;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_150;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_138;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_120;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_108;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  
  XVar5 = XR_SUCCESS;
  if (value->type != XR_TYPE_WORLD_MESH_BLOCK_ML) {
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrWorldMeshBlockML",value->type,
               "VUID-XrWorldMeshBlockML-type-type",XR_TYPE_WORLD_MESH_BLOCK_ML,
               "XR_TYPE_WORLD_MESH_BLOCK_ML");
  }
  if (check_pnext) {
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    NVar3 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs
                              ,&encountered_structs,&duplicate_ext_structs);
    if (NVar3 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)asStack_398);
      std::__cxx11::string::append((char *)&error_message);
      StructTypesToString_abi_cxx11_((string *)asStack_398,instance_info,&duplicate_ext_structs);
      std::__cxx11::string::append((string *)&error_message);
      std::__cxx11::string::~string(asStack_398);
      std::__cxx11::string::string(asStack_398,"VUID-XrWorldMeshBlockML-next-unique",&local_36a);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_78,objects_info);
      std::__cxx11::string::string
                ((string *)&local_368,
                 "Multiple structures of the same type(s) in \"next\" chain for XrWorldMeshBlockML struct"
                 ,&local_369);
      CoreValidLogMessage(instance_info,(string *)asStack_398,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_78,&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_78);
      std::__cxx11::string::~string(asStack_398);
LAB_001b7cda:
      std::__cxx11::string::~string((string *)&error_message);
      XVar5 = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (NVar3 == NEXT_CHAIN_RESULT_ERROR) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrWorldMeshBlockML-next-next",
                 (allocator *)&local_368);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_60,objects_info);
      std::__cxx11::string::string
                (asStack_398,
                 "Invalid structure(s) in \"next\" chain for XrWorldMeshBlockML struct \"next\"",
                 &local_36a);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                          ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&local_60,(string *)asStack_398);
      std::__cxx11::string::~string(asStack_398);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_60);
      goto LAB_001b7cda;
    }
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  }
  if (!check_members || XVar5 != XR_SUCCESS) {
    return XVar5;
  }
  std::__cxx11::string::string
            ((string *)&error_message,"XrWorldMeshBlockML",(allocator *)&local_368);
  std::__cxx11::string::string(asStack_398,"blockResult",(allocator *)&valid_ext_structs);
  bVar1 = ValidateXrEnum(instance_info,command_name,&error_message,(string *)asStack_398,
                         objects_info,value->blockResult);
  std::__cxx11::string::~string(asStack_398);
  std::__cxx11::string::~string((string *)&error_message);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&error_message,"XrWorldMeshBlockML",(allocator *)&local_368);
    std::__cxx11::string::string(asStack_398,"lod",(allocator *)&valid_ext_structs);
    bVar1 = ValidateXrEnum(instance_info,command_name,&error_message,(string *)asStack_398,
                           objects_info,value->lod);
    std::__cxx11::string::~string(asStack_398);
    std::__cxx11::string::~string((string *)&error_message);
    if (bVar1) {
      XVar5 = XR_SUCCESS;
      cVar2 = (value->flags < 0x40) + '\x01';
      if (value->flags == 0) {
        cVar2 = '\0';
      }
      if (cVar2 == '\x02') {
        if ((value->indexCount == 0) && (value->indexBuffer != (uint16_t *)0x0)) {
          std::__cxx11::string::string
                    ((string *)&error_message,"VUID-XrWorldMeshBlockML-indexCount-arraylength",
                     (allocator *)&local_368);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_f0,objects_info);
          std::__cxx11::string::string
                    (asStack_398,
                     "Structure XrWorldMeshBlockML member indexCount is non-optional and must be greater than 0"
                     ,(allocator *)&valid_ext_structs);
          CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_f0,(string *)asStack_398);
          std::__cxx11::string::~string(asStack_398);
          std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~_Vector_base(&local_f0);
          std::__cxx11::string::~string((string *)&error_message);
          XVar5 = XR_ERROR_VALIDATION_FAILURE;
        }
        if ((value->indexBuffer == (uint16_t *)0x0) && (value->indexCount != 0)) {
          std::__cxx11::string::string
                    ((string *)&error_message,"VUID-XrWorldMeshBlockML-indexBuffer-parameter",
                     (allocator *)&local_368);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_108,objects_info);
          std::__cxx11::string::string
                    (asStack_398,
                     "XrWorldMeshBlockML contains invalid NULL for uint16_t \"indexBuffer\" is which not optional since \"indexCount\" is set and must be non-NULL"
                     ,(allocator *)&valid_ext_structs);
          CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_108,(string *)asStack_398);
          std::__cxx11::string::~string(asStack_398);
          p_Var4 = &local_108;
        }
        else {
          if ((value->vertexCount == 0) && (value->vertexBuffer != (XrVector3f *)0x0)) {
            std::__cxx11::string::string
                      ((string *)&error_message,"VUID-XrWorldMeshBlockML-vertexCount-arraylength",
                       (allocator *)&local_368);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_120,objects_info);
            std::__cxx11::string::string
                      (asStack_398,
                       "Structure XrWorldMeshBlockML member vertexCount is non-optional and must be greater than 0"
                       ,(allocator *)&valid_ext_structs);
            CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,
                                (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                 *)&local_120,(string *)asStack_398);
            std::__cxx11::string::~string(asStack_398);
            std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ::~_Vector_base(&local_120);
            std::__cxx11::string::~string((string *)&error_message);
            XVar5 = XR_ERROR_VALIDATION_FAILURE;
          }
          if ((value->vertexBuffer == (XrVector3f *)0x0) && (value->vertexCount != 0)) {
            std::__cxx11::string::string
                      ((string *)&error_message,"VUID-XrWorldMeshBlockML-vertexBuffer-parameter",
                       (allocator *)&local_368);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_138,objects_info);
            std::__cxx11::string::string
                      (asStack_398,
                       "XrWorldMeshBlockML contains invalid NULL for XrVector3f \"vertexBuffer\" is which not optional since \"vertexCount\" is set and must be non-NULL"
                       ,(allocator *)&valid_ext_structs);
            CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,
                                (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                 *)&local_138,(string *)asStack_398);
            std::__cxx11::string::~string(asStack_398);
            p_Var4 = &local_138;
          }
          else {
            if ((value->normalCount == 0) && (value->normalBuffer != (XrVector3f *)0x0)) {
              std::__cxx11::string::string
                        ((string *)&error_message,"VUID-XrWorldMeshBlockML-normalCount-arraylength",
                         (allocator *)&local_368);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_150,objects_info);
              std::__cxx11::string::string
                        (asStack_398,
                         "Structure XrWorldMeshBlockML member normalCount is non-optional and must be greater than 0"
                         ,(allocator *)&valid_ext_structs);
              CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                  command_name,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&local_150,(string *)asStack_398);
              std::__cxx11::string::~string(asStack_398);
              std::
              _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~_Vector_base(&local_150);
              std::__cxx11::string::~string((string *)&error_message);
              XVar5 = XR_ERROR_VALIDATION_FAILURE;
            }
            if ((value->normalBuffer == (XrVector3f *)0x0) && (value->normalCount != 0)) {
              std::__cxx11::string::string
                        ((string *)&error_message,"VUID-XrWorldMeshBlockML-normalBuffer-parameter",
                         (allocator *)&local_368);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_168,objects_info);
              std::__cxx11::string::string
                        (asStack_398,
                         "XrWorldMeshBlockML contains invalid NULL for XrVector3f \"normalBuffer\" is which not optional since \"normalCount\" is set and must be non-NULL"
                         ,(allocator *)&valid_ext_structs);
              CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                  command_name,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&local_168,(string *)asStack_398);
              std::__cxx11::string::~string(asStack_398);
              p_Var4 = &local_168;
            }
            else {
              if ((value->confidenceCount == 0) && (value->confidenceBuffer != (float *)0x0)) {
                std::__cxx11::string::string
                          ((string *)&error_message,
                           "VUID-XrWorldMeshBlockML-confidenceCount-arraylength",
                           (allocator *)&local_368);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        *)&local_180,objects_info);
                std::__cxx11::string::string
                          (asStack_398,
                           "Structure XrWorldMeshBlockML member confidenceCount is non-optional and must be greater than 0"
                           ,(allocator *)&valid_ext_structs);
                CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                    command_name,
                                    (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                     *)&local_180,(string *)asStack_398);
                std::__cxx11::string::~string(asStack_398);
                std::
                _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                ::~_Vector_base(&local_180);
                std::__cxx11::string::~string((string *)&error_message);
                XVar5 = XR_ERROR_VALIDATION_FAILURE;
              }
              if (value->confidenceBuffer != (float *)0x0) {
                return XVar5;
              }
              if (value->confidenceCount == 0) {
                return XVar5;
              }
              std::__cxx11::string::string
                        ((string *)&error_message,
                         "VUID-XrWorldMeshBlockML-confidenceBuffer-parameter",
                         (allocator *)&local_368);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_198,objects_info);
              std::__cxx11::string::string
                        (asStack_398,
                         "XrWorldMeshBlockML contains invalid NULL for float \"confidenceBuffer\" is which not optional since \"confidenceCount\" is set and must be non-NULL"
                         ,(allocator *)&valid_ext_structs);
              CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                  command_name,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&local_198,(string *)asStack_398);
              std::__cxx11::string::~string(asStack_398);
              p_Var4 = &local_198;
            }
          }
        }
      }
      else {
        if (cVar2 != '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
          std::operator<<((ostream *)&error_message,
                          "XrWorldMeshBlockML invalid member XrWorldMeshDetectorFlagsML \"flags\" flag value "
                         );
          Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffc6c);
          std::operator<<((ostream *)&error_message,asStack_398);
          std::__cxx11::string::~string(asStack_398);
          std::operator<<((ostream *)&error_message," contains illegal bit");
          std::__cxx11::string::string
                    (asStack_398,"VUID-XrWorldMeshBlockML-flags-parameter",
                     (allocator *)&valid_ext_structs);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_d8,objects_info);
          std::__cxx11::stringbuf::str();
          CoreValidLogMessage(instance_info,(string *)asStack_398,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_d8,&local_368);
          std::__cxx11::string::~string((string *)&local_368);
          p_Var4 = &local_d8;
          goto LAB_001b8382;
        }
        std::__cxx11::string::string
                  ((string *)&error_message,"VUID-XrWorldMeshBlockML-flags-requiredbitmask",
                   (allocator *)&local_368);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_c0,objects_info);
        std::__cxx11::string::string
                  (asStack_398,"XrWorldMeshDetectorFlagsML \"flags\" flag must be non-zero",
                   (allocator *)&valid_ext_structs);
        CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_c0,(string *)asStack_398);
        std::__cxx11::string::~string(asStack_398);
        p_Var4 = &local_c0;
      }
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(p_Var4);
      std::__cxx11::string::~string((string *)&error_message);
      return XR_ERROR_VALIDATION_FAILURE;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,
                    "XrWorldMeshBlockML contains invalid XrWorldMeshDetectorLodML \"lod\" enum value "
                   );
    Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffc6c);
    std::operator<<((ostream *)&error_message,asStack_398);
    std::__cxx11::string::~string(asStack_398);
    std::__cxx11::string::string
              (asStack_398,"VUID-XrWorldMeshBlockML-lod-parameter",(allocator *)&valid_ext_structs);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_a8,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,(string *)asStack_398,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                        command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_a8,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    p_Var4 = &local_a8;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,
                    "XrWorldMeshBlockML contains invalid XrWorldMeshBlockResultML \"blockResult\" enum value "
                   );
    Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffc6c);
    std::operator<<((ostream *)&error_message,asStack_398);
    std::__cxx11::string::~string(asStack_398);
    std::__cxx11::string::string
              (asStack_398,"VUID-XrWorldMeshBlockML-blockResult-parameter",
               (allocator *)&valid_ext_structs);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_90,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,(string *)asStack_398,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                        command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_90,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    p_Var4 = &local_90;
  }
LAB_001b8382:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(p_Var4);
  std::__cxx11::string::~string(asStack_398);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrWorldMeshBlockML* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_WORLD_MESH_BLOCK_ML) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrWorldMeshBlockML",
                             value->type, "VUID-XrWorldMeshBlockML-type-type", XR_TYPE_WORLD_MESH_BLOCK_ML, "XR_TYPE_WORLD_MESH_BLOCK_ML");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrWorldMeshBlockML struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrWorldMeshBlockML : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrWorldMeshBlockML struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrWorldMeshBlockResultML value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrWorldMeshBlockML", "blockResult", objects_info, value->blockResult)) {
        std::ostringstream oss_enum;
        oss_enum << "XrWorldMeshBlockML contains invalid XrWorldMeshBlockResultML \"blockResult\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->blockResult));
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-blockResult-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrWorldMeshDetectorLodML value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrWorldMeshBlockML", "lod", objects_info, value->lod)) {
        std::ostringstream oss_enum;
        oss_enum << "XrWorldMeshBlockML contains invalid XrWorldMeshDetectorLodML \"lod\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->lod));
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-lod-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    ValidateXrFlagsResult world_mesh_detector_flags_ml_result = ValidateXrWorldMeshDetectorFlagsML(value->flags);
    // Flags must be non-zero in this case.
    if (VALIDATE_XR_FLAGS_ZERO == world_mesh_detector_flags_ml_result) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-flags-requiredbitmask",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, "XrWorldMeshDetectorFlagsML \"flags\" flag must be non-zero");
        return XR_ERROR_VALIDATION_FAILURE;
    } else if (VALIDATE_XR_FLAGS_SUCCESS != world_mesh_detector_flags_ml_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrWorldMeshBlockML invalid member XrWorldMeshDetectorFlagsML \"flags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->flags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-flags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->indexCount && nullptr != value->indexBuffer) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-indexCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrWorldMeshBlockML member indexCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->indexBuffer && 0 != value->indexCount) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-indexBuffer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrWorldMeshBlockML contains invalid NULL for uint16_t \"indexBuffer\" is which not "
                            "optional since \"indexCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrWorldMeshBlockML-indexBuffer-parameter" type
    // Non-optional array length must be non-zero
    if (0 >= value->vertexCount && nullptr != value->vertexBuffer) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-vertexCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrWorldMeshBlockML member vertexCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->vertexBuffer && 0 != value->vertexCount) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-vertexBuffer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrWorldMeshBlockML contains invalid NULL for XrVector3f \"vertexBuffer\" is which not "
                            "optional since \"vertexCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrWorldMeshBlockML-vertexBuffer-parameter" type
    // Non-optional array length must be non-zero
    if (0 >= value->normalCount && nullptr != value->normalBuffer) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-normalCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrWorldMeshBlockML member normalCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->normalBuffer && 0 != value->normalCount) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-normalBuffer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrWorldMeshBlockML contains invalid NULL for XrVector3f \"normalBuffer\" is which not "
                            "optional since \"normalCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrWorldMeshBlockML-normalBuffer-parameter" type
    // Non-optional array length must be non-zero
    if (0 >= value->confidenceCount && nullptr != value->confidenceBuffer) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-confidenceCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrWorldMeshBlockML member confidenceCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->confidenceBuffer && 0 != value->confidenceCount) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-confidenceBuffer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrWorldMeshBlockML contains invalid NULL for float \"confidenceBuffer\" is which not "
                            "optional since \"confidenceCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrWorldMeshBlockML-confidenceBuffer-parameter" type
    // Everything checked out properly
    return xr_result;
}